

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O0

int __thiscall VpuApiLegacy::init(VpuApiLegacy *this,EVP_PKEY_CTX *ctx)

{
  MppFrameFormat MVar1;
  MPP_RET MVar2;
  undefined4 uVar3;
  void *pvVar4;
  undefined8 uVar5;
  MppCtxType in_ECX;
  long in_RDX;
  undefined4 local_5c;
  MppPacket pvStack_58;
  RK_U32 flag;
  MppPacket pkt;
  undefined4 local_48;
  MppEncSeiMode sei_mode;
  MppPollType block;
  MppCodingType coding;
  EncParameter_t *param;
  MPP_RET local_30;
  MppCtxType type;
  MPP_RET ret;
  RK_U32 extra_size_local;
  RK_U8 *extraData_local;
  VpuCodecContext *ctx_local;
  VpuApiLegacy *this_local;
  
  type = in_ECX;
  _ret = in_RDX;
  extraData_local = (RK_U8 *)ctx;
  ctx_local = (VpuCodecContext *)this;
  if ((vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","enter\n","init");
  }
  local_30 = 0;
  if ((this->mpp_ctx == (MppCtx)0x0) || (this->mpi == (MppApi *)0x0)) {
    _mpp_log_l(2,"vpu_api_legacy","found invalid context input",0);
    this_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if (*(int *)(extraData_local + 8) == 1) {
      param._4_4_ = 0;
    }
    else {
      if (*(int *)(extraData_local + 8) != 2) {
        _mpp_log_l(2,"vpu_api_legacy","found invalid codec type %d\n",0,
                   *(undefined4 *)(extraData_local + 8));
        return -0x3eb;
      }
      param._4_4_ = 1;
    }
    local_30 = mpp_init(this->mpp_ctx,param._4_4_,*(undefined4 *)(extraData_local + 0xc));
    if (local_30 == MPP_OK) {
      if (param._4_4_ == 1) {
        _block = *(VpuApiMlvecStaticCfg **)(extraData_local + 0x88);
        sei_mode = *(MppEncSeiMode *)(extraData_local + 0xc);
        local_48 = 100;
        pkt._4_4_ = 0;
        local_30 = (*this->mpi->control)(this->mpp_ctx,MPP_SET_INPUT_TIMEOUT,&local_48);
        if (local_30 != MPP_OK) {
          _mpp_log_l(2,"vpu_api_legacy","mpi control MPP_SET_INPUT_TIMEOUT failed\n",0);
        }
        local_30 = (*this->mpi->control)
                             (this->mpp_ctx,MPP_ENC_SET_SEI_CFG,(MppParam)((long)&pkt + 4));
        if (local_30 != MPP_OK) {
          _mpp_log_l(2,"vpu_api_legacy","mpi control MPP_ENC_SET_SEI_CFG failed ret %d\n",0,local_30
                    );
        }
        if (this->memGroup == (MppBufferGroup)0x0) {
          local_30 = mpp_buffer_group_get(&this->memGroup,1,0,"vpu_api_legacy","init");
          if (local_30 != 0) {
            _mpp_log_l(2,"vpu_api_legacy","memGroup mpp_buffer_group_get failed %d\n",0,local_30);
            return local_30;
          }
          local_30 = MPP_OK;
        }
        local_30 = mpp_enc_cfg_init(&this->enc_cfg);
        if (local_30 != MPP_OK) {
          _mpp_log_l(2,"vpu_api_legacy","mpp_enc_cfg_init failed %d\n",0,local_30);
          mpp_buffer_group_put(this->memGroup);
          this->memGroup = (MppBufferGroup)0x0;
          return local_30;
        }
        MVar1 = vpu_pic_type_remap_to_mpp(_block->format);
        this->format = MVar1;
        memcpy(&this->enc_param,_block,0x40);
        MVar2 = vpu_api_mlvec_check_cfg(_block);
        if ((MVar2 == MPP_OK) && (this->mlvec == (VpuApiMlvec)0x0)) {
          vpu_api_mlvec_init(&this->mlvec);
          vpu_api_mlvec_setup(this->mlvec,this->mpp_ctx,this->mpi,this->enc_cfg);
        }
        if (this->mlvec != (VpuApiMlvec)0x0) {
          vpu_api_mlvec_set_st_cfg(this->mlvec,_block);
        }
        vpu_api_set_enc_cfg(this->mpp_ctx,this->mpi,this->enc_cfg,sei_mode,this->format,
                            (EncParameter_t *)_block);
        if (this->mlvec == (VpuApiMlvec)0x0) {
          if (this->enc_hdr_pkt == (MppPacket)0x0) {
            if (this->enc_hdr_buf == (void *)0x0) {
              this->enc_hdr_buf_size = 0x400;
              pvVar4 = (void *)mpp_osal_calloc("init",(long)this->enc_hdr_buf_size);
              this->enc_hdr_buf = pvVar4;
            }
            if (this->enc_hdr_buf != (void *)0x0) {
              mpp_packet_init(&this->enc_hdr_pkt,this->enc_hdr_buf,(long)this->enc_hdr_buf_size);
            }
          }
          if ((this->enc_hdr_pkt == (MppPacket)0x0) &&
             (_mpp_log_l(2,"vpu_api_legacy","Assertion %s failed at %s:%d\n",0,"enc_hdr_pkt","init",
                         0x1e0), (_mpp_debug & 0x10000000) != 0)) {
            abort();
          }
          if (this->enc_hdr_pkt != (MppPacket)0x0) {
            local_30 = (*this->mpi->control)(this->mpp_ctx,MPP_ENC_GET_HDR_SYNC,this->enc_hdr_pkt);
            uVar3 = mpp_packet_get_length(this->enc_hdr_pkt);
            *(undefined4 *)(extraData_local + 0x20) = uVar3;
            uVar5 = mpp_packet_get_data(this->enc_hdr_pkt);
            *(undefined8 *)(extraData_local + 0x18) = uVar5;
          }
        }
      }
      else {
        (this->vpug).CodecType = *(RK_U32 *)(extraData_local + 8);
        (this->vpug).ImgWidth = *(RK_U32 *)(extraData_local + 0x10);
        (this->vpug).ImgHeight = *(RK_U32 *)(extraData_local + 0x14);
        init_frame_info((VpuCodecContext *)extraData_local,this->mpp_ctx,this->mpi,this->frm_info,
                        &this->vpug);
        if (_ret != 0) {
          pvStack_58 = (MppPacket)0x0;
          mpp_packet_init(&stack0xffffffffffffffa8,_ret,type);
          mpp_packet_set_extra_data(pvStack_58);
          (*this->mpi->decode_put_packet)(this->mpp_ctx,pvStack_58);
          mpp_packet_deinit(&stack0xffffffffffffffa8);
        }
        local_5c = 0;
        local_30 = (*this->mpi->control)(this->mpp_ctx,MPP_DEC_SET_ENABLE_DEINTERLACE,&local_5c);
        if (local_30 != MPP_OK) {
          _mpp_log_l(2,"vpu_api_legacy","disable mpp deinterlace failed ret %d\n","init",local_30);
        }
      }
      this->init_ok = 1;
      if ((vpu_api_debug & 1) != 0) {
        _mpp_log_l(4,"vpu_api_legacy","leave\n","init");
      }
      this_local._4_4_ = local_30;
    }
    else {
      _mpp_log_l(2,"vpu_api_legacy"," init error. \n","init");
      this_local._4_4_ = local_30;
    }
  }
  return this_local._4_4_;
}

Assistant:

RK_S32 VpuApiLegacy::init(VpuCodecContext *ctx, RK_U8 *extraData, RK_U32 extra_size)
{
    vpu_api_dbg_func("enter\n");

    MPP_RET ret = MPP_OK;
    MppCtxType type;

    if (mpp_ctx == NULL || mpi == NULL) {
        mpp_err("found invalid context input");
        return MPP_ERR_NULL_PTR;
    }

    if (CODEC_DECODER == ctx->codecType) {
        type = MPP_CTX_DEC;
    } else if (CODEC_ENCODER == ctx->codecType) {
        type = MPP_CTX_ENC;
    } else {
        mpp_err("found invalid codec type %d\n", ctx->codecType);
        return MPP_ERR_VPU_CODEC_INIT;
    }

    ret = mpp_init(mpp_ctx, type, (MppCodingType)ctx->videoCoding);
    if (ret) {
        mpp_err_f(" init error. \n");
        return ret;
    }

    if (MPP_CTX_ENC == type) {
        EncParameter_t *param = (EncParameter_t*)ctx->private_data;
        MppCodingType coding = (MppCodingType)ctx->videoCoding;
        MppPollType block = (MppPollType)VPU_API_ENC_INPUT_TIMEOUT;
        MppEncSeiMode sei_mode = MPP_ENC_SEI_MODE_DISABLE;

        /* setup input / output block mode */
        ret = mpi->control(mpp_ctx, MPP_SET_INPUT_TIMEOUT, (MppParam)&block);
        if (MPP_OK != ret)
            mpp_err("mpi control MPP_SET_INPUT_TIMEOUT failed\n");

        /* disable sei by default */
        ret = mpi->control(mpp_ctx, MPP_ENC_SET_SEI_CFG, &sei_mode);
        if (ret)
            mpp_err("mpi control MPP_ENC_SET_SEI_CFG failed ret %d\n", ret);

        if (memGroup == NULL) {
            ret = mpp_buffer_group_get_internal(&memGroup, MPP_BUFFER_TYPE_ION);
            if (ret) {
                mpp_err("memGroup mpp_buffer_group_get failed %d\n", ret);
                return ret;
            }
        }

        ret = mpp_enc_cfg_init(&enc_cfg);
        if (ret) {
            mpp_err("mpp_enc_cfg_init failed %d\n", ret);
            mpp_buffer_group_put(memGroup);
            memGroup = NULL;
            return ret;
        }

        format = vpu_pic_type_remap_to_mpp((EncInputPictureType)param->format);

        memcpy(&enc_param, param, sizeof(enc_param));

        if (MPP_OK == vpu_api_mlvec_check_cfg(param)) {
            if (NULL == mlvec) {
                vpu_api_mlvec_init(&mlvec);
                vpu_api_mlvec_setup(mlvec, mpp_ctx, mpi, enc_cfg);
            }
        }

        if (mlvec)
            vpu_api_mlvec_set_st_cfg(mlvec, (VpuApiMlvecStaticCfg *)param);

        vpu_api_set_enc_cfg(mpp_ctx, mpi, enc_cfg, coding, format, param);

        if (!mlvec) {
            if (NULL == enc_hdr_pkt) {
                if (NULL == enc_hdr_buf) {
                    enc_hdr_buf_size = SZ_1K;
                    enc_hdr_buf = mpp_calloc_size(RK_U8, enc_hdr_buf_size);
                }

                if (enc_hdr_buf)
                    mpp_packet_init(&enc_hdr_pkt, enc_hdr_buf, enc_hdr_buf_size);
            }

            mpp_assert(enc_hdr_pkt);
            if (enc_hdr_pkt) {
                ret = mpi->control(mpp_ctx, MPP_ENC_GET_HDR_SYNC, enc_hdr_pkt);
                ctx->extradata_size = mpp_packet_get_length(enc_hdr_pkt);
                ctx->extradata      = mpp_packet_get_data(enc_hdr_pkt);
            }
        }
    } else { /* MPP_CTX_DEC */
        vpug.CodecType  = ctx->codecType;
        vpug.ImgWidth   = ctx->width;
        vpug.ImgHeight  = ctx->height;

        init_frame_info(ctx, mpp_ctx, mpi, frm_info, &vpug);

        if (extraData != NULL) {
            MppPacket pkt = NULL;

            mpp_packet_init(&pkt, extraData, extra_size);
            mpp_packet_set_extra_data(pkt);
            mpi->decode_put_packet(mpp_ctx, pkt);
            mpp_packet_deinit(&pkt);
        }

        RK_U32 flag = 0;
        ret = mpi->control(mpp_ctx, MPP_DEC_SET_ENABLE_DEINTERLACE, &flag);
        if (ret)
            mpp_err_f("disable mpp deinterlace failed ret %d\n", ret);
    }

    init_ok = 1;

    vpu_api_dbg_func("leave\n");
    return ret;
}